

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O2

string * adios2::helper::FileToString(string *__return_storage_ptr__,string *fileName,string *hint)

{
  allocator local_443;
  allocator local_442;
  allocator local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  string local_3c0;
  ostringstream fileSS;
  ifstream fileStream;
  streambuf local_218 [16];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&fileStream,(string *)fileName,_S_in);
  if ((abStack_208[*(long *)(_fileStream + -0x18)] & 5) != 0) {
    std::__cxx11::string::string((string *)&fileSS,"Helper",&local_441);
    std::__cxx11::string::string((string *)&local_3c0,"adiosString",&local_442);
    std::__cxx11::string::string((string *)&local_3e0,"FileToString",&local_443);
    std::operator+(&local_440,"file ",fileName);
    std::operator+(&local_420,&local_440," not found, ");
    std::operator+(&local_400,&local_420,hint);
    Throw<std::ios_base::failure[abi:cxx11]>((string *)&fileSS,&local_3c0,&local_3e0,&local_400,-1);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&fileSS);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileSS);
  std::ostream::operator<<(&fileSS,local_218);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileSS);
  std::ifstream::~ifstream(&fileStream);
  return __return_storage_ptr__;
}

Assistant:

std::string FileToString(const std::string &fileName, const std::string hint)
{
    std::ifstream fileStream(fileName);

    if (!fileStream)
    {
        helper::Throw<std::ios_base::failure>("Helper", "adiosString", "FileToString",
                                              "file " + fileName + " not found, " + hint);
    }

    std::ostringstream fileSS;
    fileSS << fileStream.rdbuf();
    fileStream.close();
    return fileSS.str();
}